

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

void __thiscall amrex::ParmParse::pushPrefix(ParmParse *this,string *str)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Elt_pointer pbVar3;
  long *plVar4;
  long *plVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string s;
  long *local_88 [2];
  long local_78 [2];
  value_type local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + str->_M_string_length);
  if (local_68._M_string_length == 0) goto LAB_00501978;
  pbVar3 = (this->m_pstack).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar3 == (this->m_pstack).c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar2 = (this->m_pstack).c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    sVar6 = pbVar2[0xf]._M_string_length;
    if (sVar6 != 0) {
      pbVar3 = pbVar2 + 0x10;
      goto LAB_005018ae;
    }
  }
  else {
    sVar6 = pbVar3[-1]._M_string_length;
    if (sVar6 != 0) {
LAB_005018ae:
      pcVar1 = pbVar3[-1]._M_dataplus._M_p;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>((string *)local_88,pcVar1,pcVar1 + sVar6);
      std::__cxx11::string::append((char *)local_88);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_88,(ulong)local_68._M_dataplus._M_p);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_38 = *plVar5;
        lStack_30 = plVar4[3];
        local_48 = &local_38;
      }
      else {
        local_38 = *plVar5;
        local_48 = (long *)*plVar4;
      }
      local_40 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,local_38 + 1);
      }
      if (local_88[0] != local_78) {
        operator_delete(local_88[0],local_78[0] + 1);
      }
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,&local_68);
LAB_00501978:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ParmParse::pushPrefix (const std::string& str)
{
    std::string s(str);
    if ( !s.empty() )
    {
        if ( !m_pstack.top().empty() )
        {
            s = m_pstack.top() + "." + s;
        }
        m_pstack.push(s);
    }
}